

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_algorithms_tests.hpp
# Opt level: O2

void test_parallel_for(void)

{
  undefined4 uVar1;
  undefined8 uVar2;
  int __val;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  int iVar7;
  test __t;
  allocator<char> local_1ba;
  __allocator_type __a2;
  undefined1 local_1b8 [36];
  int local_194;
  int local_190;
  int local_18c;
  undefined1 local_188 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_178;
  undefined8 local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_160;
  __shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
  local_158;
  undefined1 local_148 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_138;
  undefined4 local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  undefined1 local_110 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_100;
  shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>_>
  spTaskGroup;
  shared_ptr<oqpi::simple_partitioner> spPartitioner;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Elt_pointer local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  test::test(&__t,"test_parallel_for");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"FibonacciParallelFor",&local_1ba);
  iVar7 = gTaskCount;
  local_124 = 0;
  local_120 = gTaskCount;
  local_11c = gTaskCount;
  if (gTaskCount <
      (int)oqpi::
           helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
           ::scheduler_._32_4_) {
    local_110._0_4_ = 0;
    local_114 = 1;
    iVar5 = gTaskCount;
  }
  else {
    local_114 = gTaskCount /
                (int)oqpi::
                     helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
                     ::scheduler_._32_4_;
    local_110._0_4_ =
         gTaskCount %
         (int)oqpi::
              helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
              ::scheduler_._32_4_;
    iVar5 = oqpi::
            helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
            ::scheduler_._32_4_;
  }
  local_110._4_4_ = 0;
  local_118 = iVar5;
  if (gTaskCount < 1) {
    local_158._M_ptr = (element_type *)0x0;
    local_158._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                   &local_50," (");
    std::__cxx11::to_string(&local_c8,iVar7);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                   &local_c8);
    std::operator+(&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   " items)");
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)local_188);
    oqpi::
    make_parallel_group<(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::scheduler<concurrent_queue>>
              ((oqpi *)&spTaskGroup,
               (scheduler<concurrent_queue> *)
               oqpi::
               helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
               ::scheduler_,&local_88,normal,iVar5,0);
    std::make_shared<oqpi::simple_partitioner,oqpi::simple_partitioner_const&>
              ((simple_partitioner *)&spPartitioner);
    iVar7 = 0;
    if (0 < iVar5) {
      iVar7 = iVar5;
    }
    local_194 = iVar5;
    iVar5 = 0;
    while( true ) {
      __val = local_194;
      if (iVar7 == 0) break;
      local_18c = iVar5 + 1;
      std::__cxx11::to_string((string *)local_148,local_18c);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                     "Batch ",(string *)local_148);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                     "/");
      std::__cxx11::to_string(&local_a8,__val);
      local_190 = iVar7 + -1;
      std::operator+(&local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     &local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)local_1b8);
      std::__cxx11::string::~string((string *)local_188);
      std::__cxx11::string::~string((string *)local_148);
      local_148._0_4_ = iVar5;
      std::__shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2> *)
                 (local_148 + 8),
                 &spPartitioner.
                  super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>);
      uVar3 = aStack_138._M_allocated_capacity;
      uVar2 = local_148._8_8_;
      uVar1 = local_148._0_4_;
      local_188._0_4_ = local_148._0_4_;
      local_188._8_8_ = local_148._8_8_;
      aStack_178._M_allocated_capacity = aStack_138._M_allocated_capacity;
      local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      aStack_138._M_allocated_capacity = 0;
      local_168 = (__pthread_internal_list *)0x0;
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
      local_a8._M_dataplus._M_p = (pointer)&__a2;
      p_Var6->_M_use_count = 1;
      p_Var6->_M_weak_count = 1;
      p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00215378;
      local_1b8._0_4_ = uVar1;
      local_1b8._8_8_ = uVar2;
      local_1b8._16_8_ = uVar3;
      local_188._8_8_ = 0;
      aStack_178._M_allocated_capacity = 0;
      p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_base_00215140;
      LOCK();
      UNLOCK();
      uVar1 = oqpi::task_base::uid_provider()::uid_generator._4_4_;
      lVar4 = oqpi::task_base::uid_provider()::uid_generator + 1;
      p_Var6[1]._M_use_count = (undefined4)oqpi::task_base::uid_provider()::uid_generator;
      oqpi::task_base::uid_provider()::uid_generator = lVar4;
      p_Var6[1]._M_weak_count = uVar1;
      p_Var6[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var6[2]._M_use_count = 0;
      p_Var6[2]._M_weak_count = 0;
      *(undefined2 *)&p_Var6[3]._vptr__Sp_counted_base = 2;
      *(undefined1 *)((long)&p_Var6[3]._vptr__Sp_counted_base + 2) = 0;
      p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_002153c8;
      local_a8._M_string_length = (size_type)p_Var6;
      timer_task_context::timer_task_context
                ((timer_task_context *)&p_Var6[3]._M_use_count,(task_base *)(p_Var6 + 1),&local_c8);
      uVar2 = local_1b8._16_8_;
      p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_002153c8;
      *(undefined4 *)&p_Var6[4]._vptr__Sp_counted_base = local_1b8._0_4_;
      local_1b8._16_8_ = 0;
      p_Var6[4]._M_use_count = local_1b8._8_4_;
      p_Var6[4]._M_weak_count = local_1b8._12_4_;
      p_Var6[5]._vptr__Sp_counted_base = (_func_int **)uVar2;
      local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 0x10));
      local_a8._M_string_length = 0;
      local_168 = (task_base *)(p_Var6 + 1);
      _Stack_160._M_pi = p_Var6;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/task.hpp:151:18)>,_std::allocator<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/task.hpp:151:18)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>,_std::allocator<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_178._M_allocated_capacity);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_138._M_allocated_capacity);
      _Stack_100._M_pi = _Stack_160._M_pi;
      local_110._8_8_ = local_168;
      local_168 = (__pthread_internal_list *)0x0;
      _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_60 = (_Elt_pointer)0x0;
      _Stack_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      oqpi::
      task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
      ::addTask(&(spTaskGroup.
                  super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->
                 super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
                ,(task_handle *)(local_110 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_100);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_160);
      std::__cxx11::string::~string((string *)&local_c8);
      iVar7 = local_190;
      iVar5 = local_18c;
    }
    local_158._M_ptr =
         spTaskGroup.
         super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_158._M_refcount._M_pi =
         spTaskGroup.
         super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    spTaskGroup.
    super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    spTaskGroup.
    super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&spPartitioner.
                super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&spTaskGroup.
                super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string((string *)&local_88);
    if (local_158._M_ptr != (element_type *)0x0) {
      std::__shared_ptr<oqpi::task_base,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,void>
                ((__shared_ptr<oqpi::task_base,(__gnu_cxx::_Lock_policy)2> *)&local_88,&local_158);
      local_188._0_8_ = local_88._M_dataplus._M_p;
      local_188._8_8_ = local_88._M_string_length;
      local_88._M_dataplus._M_p = (pointer)0x0;
      local_88._M_string_length = 0;
      oqpi::scheduler<concurrent_queue>::add
                ((scheduler<concurrent_queue> *)local_1b8,
                 (task_handle *)
                 oqpi::
                 helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
                 ::scheduler_);
      oqpi::task_handle::activeWait((task_handle *)local_1b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
  std::__cxx11::string::~string((string *)&local_50);
  test::~test(&__t);
  return;
}

Assistant:

void test_parallel_for()
{
    TEST_FUNC;

    oqpi_tk::parallel_for("FibonacciParallelFor", gTaskCount, [](int32_t i)
    {
        volatile auto a = 0ull;
        a += fibonacci(gValue + a);
        a += i;
    });
}